

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O3

void __thiscall Cgmres<Model1>::Cgmres(Cgmres<Model1> *this)

{
  double *pdVar1;
  
  Gmres::Gmres(&this->super_Gmres,300,5,1e-06);
  (this->super_Gmres)._vptr_Gmres = (_func_int **)&PTR_Ax_func_00106d48;
  this->t = 0.0;
  pdVar1 = (double *)operator_new__(0x960);
  this->U = pdVar1;
  pdVar1 = (double *)operator_new__(0x960);
  this->dUdt = pdVar1;
  pdVar1 = (double *)operator_new__(0x20);
  this->x_dxh = pdVar1;
  pdVar1 = (double *)operator_new__(0x330);
  this->ptau = pdVar1;
  pdVar1 = (double *)operator_new__(0x960);
  this->F_dxh_h = pdVar1;
  return;
}

Assistant:

Cgmres(void) : Gmres(len, Model::k_max, Model::tol) {
    t = 0.0;
    U = new double[dim_u * dv];
    dUdt = new double[dim_u * dv];

    x_dxh = new double[dim_x];
    ptau = new double[dim_p * (dv + 1)];

    F_dxh_h = new double[dim_u * dv];
  }